

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O1

void __thiscall CPT::CPT(CPT *this,size_t X,size_t Y)

{
  size_type sVar1;
  double *pdVar2;
  size_type __n;
  pointer __s;
  
  (this->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface = (_func_int **)&PTR__CPT_005e7780;
  (this->_m_probTable).size1_ = X;
  (this->_m_probTable).size2_ = Y;
  __n = Y * X;
  (this->_m_probTable).data_.size_ = __n;
  if (__n == 0) {
    pdVar2 = (double *)0x0;
  }
  else {
    pdVar2 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)&(this->_m_probTable).data_,__n,(void *)0x0);
  }
  (this->_m_probTable).data_.data_ = pdVar2;
  if (X != 0) {
    sVar1 = (this->_m_probTable).size2_;
    __s = (this->_m_probTable).data_.data_;
    do {
      if (Y != 0) {
        memset(__s,0,Y * 8);
      }
      __s = __s + sVar1;
      X = X - 1;
    } while (X != 0);
  }
  return;
}

Assistant:

CPT::CPT(size_t X, size_t Y)
    :
    _m_probTable(X,Y)
{   
   for(size_t x=0; x < X; x++) 
       for(size_t y=0; y < Y; y++) 
           _m_probTable(x,y)=0;
}